

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::Get(DBImpl *this,ReadOptions *options,Slice *key,string *value)

{
  Snapshot **__mutex;
  _func_int **s;
  MemTable *this_00;
  MemTable *this_01;
  Version *this_02;
  VersionSet *pVVar1;
  bool bVar2;
  int iVar3;
  Snapshot *pSVar4;
  string *in_R8;
  GetStats stats;
  LookupKey lkey;
  undefined1 local_130 [32];
  LookupKey local_110;
  
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  __mutex = &options[0xc].snapshot;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pSVar4 = (Snapshot *)(key->size_ + 0x18);
  if (key->size_ == 0) {
    pSVar4 = options[0x22].snapshot + 0xb;
  }
  s = pSVar4->_vptr_Snapshot;
  this_00 = *(MemTable **)(options + 0x13);
  this_01 = (MemTable *)options[0x13].snapshot;
  this_02 = (Version *)options[0x22].snapshot[0x2d]._vptr_Snapshot;
  this_00->refs_ = this_00->refs_ + 1;
  if (this_01 != (MemTable *)0x0) {
    this_01->refs_ = this_01->refs_ + 1;
  }
  local_130._8_8_ = key;
  Version::Ref(this_02);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  LookupKey::LookupKey(&local_110,(Slice *)value,(SequenceNumber)s);
  bVar2 = MemTable::Get(this_00,&local_110,in_R8,(Status *)this);
  if (bVar2) {
LAB_0010ea45:
    bVar2 = false;
  }
  else {
    if (this_01 != (MemTable *)0x0) {
      bVar2 = MemTable::Get(this_01,&local_110,in_R8,(Status *)this);
      if (bVar2) goto LAB_0010ea45;
    }
    Version::Get((Version *)local_130,(ReadOptions *)this_02,(LookupKey *)local_130._8_8_,
                 (string *)&local_110,(GetStats *)in_R8);
    pVVar1 = (VersionSet *)(this->super_DB)._vptr_DB;
    (this->super_DB)._vptr_DB = (_func_int **)local_130._0_8_;
    local_130._0_8_ = pVVar1;
    if (pVVar1 != (VersionSet *)0x0) {
      operator_delete__(pVVar1);
    }
    bVar2 = true;
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    if ((pointer)local_110.start_ != (pointer)0x0 && local_110.start_ != local_110.space_) {
      operator_delete__(local_110.start_);
    }
    if (bVar2) {
      bVar2 = Version::UpdateStats(this_02,(GetStats *)(local_130 + 0x10));
      if (bVar2) {
        MaybeScheduleCompaction((DBImpl *)options);
      }
    }
    MemTable::Unref(this_00);
    if (this_01 != (MemTable *)0x0) {
      MemTable::Unref(this_01);
    }
    Version::Unref(this_02);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return (Status)(char *)this;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

Status DBImpl::Get(const ReadOptions& options, const Slice& key,
                   std::string* value) {
  Status s;
  MutexLock l(&mutex_);
  SequenceNumber snapshot;
  if (options.snapshot != nullptr) {
    snapshot =
        static_cast<const SnapshotImpl*>(options.snapshot)->sequence_number();
  } else {
    snapshot = versions_->LastSequence();
  }

  MemTable* mem = mem_;
  MemTable* imm = imm_;
  Version* current = versions_->current();
  mem->Ref();
  if (imm != nullptr) imm->Ref();
  current->Ref();

  bool have_stat_update = false;
  Version::GetStats stats;

  // Unlock while reading from files and memtables
  {
    mutex_.Unlock();
    // First look in the memtable, then in the immutable memtable (if any).
    LookupKey lkey(key, snapshot);
    if (mem->Get(lkey, value, &s)) {
      // Done
    } else if (imm != nullptr && imm->Get(lkey, value, &s)) {
      // Done
    } else {
      s = current->Get(options, lkey, value, &stats);
      have_stat_update = true;
    }
    mutex_.Lock();
  }

  if (have_stat_update && current->UpdateStats(stats)) {
    MaybeScheduleCompaction();
  }
  mem->Unref();
  if (imm != nullptr) imm->Unref();
  current->Unref();
  return s;
}